

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O0

BlockOperationInfo * __thiscall
adios2::format::BP4Deserializer::InitPostOperatorBlockData
          (BP4Deserializer *this,
          vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>
          *blockOperationsInfo)

{
  bool bVar1;
  reference this_00;
  mapped_type *__x;
  const_reference pvVar2;
  string type;
  BlockOperationInfo *blockOperationInfo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>
  *__range2;
  size_t index;
  vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>
  *in_stack_ffffffffffffff48;
  vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>
  *in_stack_ffffffffffffff50;
  key_type *__k;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 local_79 [33];
  string local_58 [32];
  reference local_38;
  BlockOperationInfo *local_30;
  __normal_iterator<const_adios2::helper::BlockOperationInfo_*,_std::vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>_>
  local_28 [2];
  long local_18;
  
  local_18 = 0;
  local_28[0]._M_current =
       (BlockOperationInfo *)
       std::
       vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>
       ::begin(in_stack_ffffffffffffff48);
  local_30 = (BlockOperationInfo *)
             std::
             vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>
             ::end(in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_adios2::helper::BlockOperationInfo_*,_std::vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<const_adios2::helper::BlockOperationInfo_*,_std::vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_adios2::helper::BlockOperationInfo_*,_std::vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>_>
              ::operator*(local_28);
    __k = (key_type *)local_79;
    local_38 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_79 + 1),"Type",(allocator *)__k);
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),__k);
    std::__cxx11::string::string(local_58,(string *)__x);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    in_stack_ffffffffffffff50 =
         (vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>
          *)std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,__x);
    if (in_stack_ffffffffffffff50 ==
        (vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>
         *)0x1) {
      in_stack_ffffffffffffff70 = 2;
    }
    else {
      local_18 = local_18 + 1;
      in_stack_ffffffffffffff70 = 0;
    }
    std::__cxx11::string::~string(local_58);
    if (in_stack_ffffffffffffff70 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_adios2::helper::BlockOperationInfo_*,_std::vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>_>
    ::operator++(local_28);
  }
  pvVar2 = std::
           vector<adios2::helper::BlockOperationInfo,_std::allocator<adios2::helper::BlockOperationInfo>_>
           ::at(in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
  return pvVar2;
}

Assistant:

const helper::BlockOperationInfo &BP4Deserializer::InitPostOperatorBlockData(
    const std::vector<helper::BlockOperationInfo> &blockOperationsInfo) const
{
    size_t index = 0;
    for (const helper::BlockOperationInfo &blockOperationInfo : blockOperationsInfo)
    {
        const std::string type = blockOperationInfo.Info.at("Type");
        if (m_TransformTypes.count(type) == 1)
        {
            break;
        }
        ++index;
    }
    return blockOperationsInfo.at(index);
}